

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolAlloc.cpp
# Opt level: O2

void __thiscall glslang::TPoolAllocator::~TPoolAllocator(TPoolAllocator *this)

{
  tHeader *ptVar1;
  tHeader *ptVar2;
  
  ptVar2 = this->inUseList;
  while (ptVar2 != (tHeader *)0x0) {
    ptVar1 = ptVar2->nextPage;
    tHeader::~tHeader(ptVar2);
    if (this->inUseList != (tHeader *)0x0) {
      operator_delete__(this->inUseList);
    }
    this->inUseList = ptVar1;
    ptVar2 = ptVar1;
  }
  ptVar2 = this->freeList;
  while (ptVar2 != (tHeader *)0x0) {
    ptVar1 = ptVar2->nextPage;
    operator_delete__(ptVar2);
    this->freeList = ptVar1;
    ptVar2 = ptVar1;
  }
  std::
  _Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
  ::~_Vector_base(&(this->stack).
                   super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                 );
  return;
}

Assistant:

TPoolAllocator::~TPoolAllocator()
{
    while (inUseList) {
        tHeader* next = inUseList->nextPage;
        inUseList->~tHeader();
        delete [] reinterpret_cast<char*>(inUseList);
        inUseList = next;
    }

    //
    // Always delete the free list memory - it can't be being
    // (correctly) referenced, whether the pool allocator was
    // global or not.  We should not check the guard blocks
    // here, because we did it already when the block was
    // placed into the free list.
    //
    while (freeList) {
        tHeader* next = freeList->nextPage;
        delete [] reinterpret_cast<char*>(freeList);
        freeList = next;
    }
}